

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint32 uVar7;
  uint8 *puVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  static_huffman_data_model dm;
  static_huffman_data_model local_58;
  
  pcVar2 = this->m_pHeader;
  bVar5 = (pcVar2->m_format).m_buf[0];
  bVar3 = true;
  if (bVar5 - 0xc < 3) {
LAB_001137a7:
    bVar20 = bVar5 == 0xc;
  }
  else {
    bVar20 = true;
    if (1 < bVar5 - 10) {
      bVar3 = false;
      goto LAB_001137a7;
    }
  }
  uVar9 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar9 != 0) {
    puVar8 = this->m_pData +
             ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar8;
    (this->m_codec).m_pDecode_buf_next = puVar8;
    (this->m_codec).m_decode_buf_size = uVar9;
    (this->m_codec).m_pDecode_buf_end = puVar8 + uVar9;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&local_58);
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  uVar17 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << bVar20;
  this_00 = &this->m_color_selectors;
  uVar9 = (this->m_color_selectors).m_size;
  if (uVar9 != uVar17) {
    if (uVar9 <= uVar17) {
      if ((this->m_color_selectors).m_capacity < uVar17) {
        bVar4 = elemental_vector::increase_capacity
                          ((elemental_vector *)this_00,uVar17,uVar9 + 1 == uVar17,4,
                           (object_mover)0x0);
        if (!bVar4) {
          (this->m_color_selectors).m_alloc_failed = true;
          goto LAB_001138a7;
        }
        uVar9 = (this->m_color_selectors).m_size;
      }
      memset(this_00->m_p + uVar9,0,(ulong)(uVar17 - uVar9) << 2);
    }
    (this->m_color_selectors).m_size = uVar17;
  }
LAB_001138a7:
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  if ((uVar1 & 0xff) != 0 || uVar1 >> 8 != 0) {
    uVar12 = 0;
    uVar9 = 0 << bVar20;
    do {
      uVar17 = 0xfffffffc;
      do {
        uVar17 = uVar17 + 4;
        uVar7 = symbol_codec::decode(&this->m_codec,&local_58);
        uVar9 = uVar9 ^ uVar7 << ((byte)uVar17 & 0x1f);
      } while (uVar17 < 0x1c);
      if (bVar3) {
        uVar18 = ~(uVar9 >> 1 & 0x55555555 ^ uVar9);
        uVar17 = (uint)uVar12 * 2 + 1;
        if (bVar20 == false) {
          uVar17 = (uint)uVar12;
        }
        bVar15 = 8;
        bVar5 = 0;
        bVar16 = 0;
        iVar10 = 0;
        do {
          iVar19 = 0;
          bVar14 = bVar15;
          bVar6 = bVar5;
          bVar11 = bVar16;
          do {
            if (bVar20 != false) {
              uVar13 = uVar18 >> (bVar6 & 0x1f);
              this_00->m_p[uVar12 * 2] =
                   this_00->m_p[uVar12 * 2] |
                   ((uVar13 & 1) << 0x10 | uVar13 >> 1 & 1) << (bVar14 & 0xf);
            }
            uVar13 = uVar18 >> (bVar11 & 0x1f);
            this_00->m_p[uVar17] =
                 this_00->m_p[uVar17] | ((uVar13 & 1) << 0x10 | uVar13 >> 1 & 1) << (bVar14 & 0xf);
            bVar14 = bVar14 + 4;
            iVar19 = iVar19 + -4;
            bVar11 = bVar11 + 2;
            bVar6 = bVar6 + 8;
          } while (iVar19 != -0x10);
          iVar10 = iVar10 + 1;
          bVar15 = bVar15 + 1;
          bVar16 = bVar16 + 8;
          bVar5 = bVar5 + 2;
        } while (iVar10 != 4);
      }
      else {
        this_00->m_p[uVar12] = uVar9 >> 1 & 0x55555555 | (uVar9 * 2 ^ uVar9) & 0xaaaaaaaa;
      }
      uVar12 = uVar12 + 1;
      uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
    } while (uVar12 < (ushort)(uVar1 << 8 | uVar1 >> 8));
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return true;
}

Assistant:

bool decode_color_selectors() {
    const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
    const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
    m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
    static_huffman_data_model dm;
    m_codec.decode_receive_static_data_model(dm);
    m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
    for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++) {
      for (uint32 j = 0; j < 32; j += 4)
        s ^= m_codec.decode(dm) << j;
      if (has_etc_color_blocks) {
        for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15) {
          for (uint32 w = 0; w < 4; w++, t += 4) {
            if (has_subblocks) {
              uint32 s0 = selector >> (w << 3 | h << 1);
              m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
            }
            uint32 s1 = selector >> (h << 3 | w << 1);
            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
          }
        }
      } else {
        m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
      }
    }
    m_codec.stop_decoding();
    return true;
  }